

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  bool bVar1;
  string sVar2;
  int iVar3;
  RegexpStatusCode code;
  ErrorCode EVar4;
  Regexp *foldcase;
  ostream *poVar5;
  void *pvVar6;
  Regexp *pRVar7;
  LogMessage *pLVar8;
  Prog *pPVar9;
  string *this_00;
  Options *in_RDX;
  string *in_RDI;
  double __x;
  double __x_00;
  Regexp *suffix;
  RegexpStatus status;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  Regexp *in_stack_fffffffffffffb10;
  LogMessage *in_stack_fffffffffffffb20;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb28;
  once_flag *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb40;
  int line;
  Regexp *in_stack_fffffffffffffb48;
  char *file;
  LogMessage *in_stack_fffffffffffffb50;
  RegexpStatus *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined4 in_stack_fffffffffffffbb0;
  undefined1 local_431 [241];
  Options *in_stack_fffffffffffffcc0;
  undefined8 local_280;
  string local_270 [32];
  string local_250 [48];
  re2 local_220 [296];
  RegexpStatus *in_stack_ffffffffffffff08;
  ParseFlags in_stack_ffffffffffffff14;
  StringPiece *in_stack_ffffffffffffff18;
  Prog *in_stack_ffffffffffffffb8;
  Regexp local_40;
  Options *local_18;
  
  line = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
  local_18 = in_RDX;
  std::call_once<re2::RE2::Init(re2::StringPiece_const&,re2::RE2::Options_const&)::__0>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  pRVar7 = &local_40;
  StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffb48);
  std::__cxx11::string::operator=(in_RDI,(string *)pRVar7);
  std::__cxx11::string::~string((string *)pRVar7);
  Options::Copy((Options *)(in_RDI + 0x20),local_18);
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = empty_string_abi_cxx11_;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  RegexpStatus::RegexpStatus((RegexpStatus *)in_stack_fffffffffffffb10);
  StringPiece::StringPiece
            ((StringPiece *)in_stack_fffffffffffffb10,
             (string *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  iVar3 = Options::ParseFlags(in_stack_fffffffffffffcc0);
  foldcase = Regexp::Parse(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                           in_stack_ffffffffffffff08);
  *(Regexp **)(in_RDI + 0x60) = foldcase;
  if (*(long *)(in_RDI + 0x60) == 0) {
    bVar1 = Options::log_errors((Options *)(in_RDI + 0x20));
    if (bVar1) {
      LogMessage::LogMessage(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48,line);
      poVar5 = LogMessage::stream((LogMessage *)(local_220 + 0x20));
      poVar5 = std::operator<<(poVar5,"Error parsing \'");
      StringPiece::StringPiece
                ((StringPiece *)in_stack_fffffffffffffb10,
                 (string *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      trunc_abi_cxx11_(local_220,__x);
      poVar5 = std::operator<<(poVar5,(string *)local_220);
      poVar5 = std::operator<<(poVar5,"\': ");
      RegexpStatus::Text_abi_cxx11_(in_stack_fffffffffffffb68);
      std::operator<<(poVar5,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string((string *)local_220);
      LogMessage::~LogMessage(in_stack_fffffffffffffb20);
    }
    pvVar6 = operator_new(0x20);
    RegexpStatus::Text_abi_cxx11_(in_stack_fffffffffffffb68);
    *(void **)(in_RDI + 0x88) = pvVar6;
    code = RegexpStatus::code((RegexpStatus *)&stack0xffffffffffffffa0);
    EVar4 = RegexpErrorToRE2(code);
    *(ErrorCode *)(in_RDI + 0x90) = EVar4;
    RegexpStatus::error_arg((RegexpStatus *)&stack0xffffffffffffffa0);
    StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffb48);
    std::__cxx11::string::operator=(in_RDI + 0x98,local_270);
    std::__cxx11::string::~string(local_270);
  }
  else {
    bVar1 = Regexp::RequiredPrefix
                      (pRVar7,(string *)CONCAT44(iVar3,in_stack_fffffffffffffbb0),(bool *)foldcase,
                       (Regexp **)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
    if (bVar1) {
      *(undefined8 *)(in_RDI + 0x68) = local_280;
    }
    else {
      pRVar7 = Regexp::Incref(in_stack_fffffffffffffb48);
      *(Regexp **)(in_RDI + 0x68) = pRVar7;
    }
    file = *(char **)(in_RDI + 0x68);
    pLVar8 = (LogMessage *)Options::max_mem((Options *)(in_RDI + 0x20));
    pPVar9 = Regexp::CompileToProg
                       (in_stack_fffffffffffffb10,
                        CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    *(Prog **)(in_RDI + 0x70) = pPVar9;
    if (*(long *)(in_RDI + 0x70) == 0) {
      bVar1 = Options::log_errors((Options *)(in_RDI + 0x20));
      if (bVar1) {
        LogMessage::LogMessage(pLVar8,file,(int)((ulong)pPVar9 >> 0x20));
        poVar5 = LogMessage::stream((LogMessage *)(local_431 + 0x31));
        poVar5 = std::operator<<(poVar5,"Error compiling \'");
        StringPiece::StringPiece
                  ((StringPiece *)in_stack_fffffffffffffb10,
                   (string *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        trunc_abi_cxx11_((re2 *)(local_431 + 0x11),__x_00);
        pLVar8 = (LogMessage *)std::operator<<(poVar5,(string *)(local_431 + 0x11));
        std::operator<<((ostream *)pLVar8,"\'");
        std::__cxx11::string::~string((string *)(local_431 + 0x11));
        LogMessage::~LogMessage(pLVar8);
      }
      this_00 = (string *)operator_new(0x20);
      in_stack_fffffffffffffb10 = (Regexp *)local_431;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (this_00,"pattern too large - compile failed",(allocator *)in_stack_fffffffffffffb10
                );
      *(string **)(in_RDI + 0x88) = this_00;
      std::allocator<char>::~allocator((allocator<char> *)local_431);
      *(undefined4 *)(in_RDI + 0x90) = 0xe;
    }
    else {
      iVar3 = Regexp::NumCaptures((Regexp *)pLVar8);
      *(int *)(in_RDI + 0x78) = iVar3;
      sVar2 = (string)Prog::IsOnePass(in_stack_ffffffffffffffb8);
      in_RDI[0x7c] = sVar2;
    }
  }
  RegexpStatus::~RegexpStatus((RegexpStatus *)in_stack_fffffffffffffb10);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    empty_string = new std::string;
    empty_named_groups = new std::map<std::string, int>;
    empty_group_names = new std::map<int, std::string>;
  });

  pattern_ = std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  prog_ = NULL;
  num_captures_ = -1;
  rprog_ = NULL;
  error_ = empty_string;
  error_code_ = NoError;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = std::string(status.error_arg());
    return;
  }

  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &prefix_foldcase_, &suffix))
    suffix_regexp_ = suffix;
  else
    suffix_regexp_ = entire_regexp_->Incref();

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}